

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_Writer::WriteFile(OSTEI_Writer *this)

{
  bool bVar1;
  ostream *poVar2;
  long in_RDI;
  OSTEI_Writer *in_stack_00000020;
  QAM am;
  QAM *in_stack_00000220;
  OSTEI_Writer *in_stack_00000228;
  OSTEI_Writer *in_stack_00000ea0;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QAM *in_stack_ffffffffffffff50;
  string local_68 [104];
  
  GeneratorInfoBase::FinalAM
            ((GeneratorInfoBase *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  Write_Full_(in_stack_00000ea0);
  poVar2 = *(ostream **)(in_RDI + 0x10);
  QAM::QAM(in_stack_ffffffffffffff50,
           (QAM *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  FunctionPrototype__abi_cxx11_(in_stack_00000228,in_stack_00000220);
  poVar2 = std::operator<<(poVar2,local_68);
  std::operator<<(poVar2,";\n\n");
  std::__cxx11::string::~string(local_68);
  QAM::~QAM((QAM *)0x15e18e);
  bVar1 = GeneratorInfoBase::FinalPermute((GeneratorInfoBase *)0x15e19c);
  if (bVar1) {
    Write_Permutations_(in_stack_00000020);
  }
  QAM::~QAM((QAM *)0x15e20b);
  return;
}

Assistant:

void OSTEI_Writer::WriteFile(void) const
{
    const QAM am = info_.FinalAM();

    // is this a special permutation? Handle it if so.
    Write_Full_();

    // Add to the header
    osh_ << FunctionPrototype_(am) << ";\n\n";

    // Write out the code for permuting final integrals, if necessary
    if(info_.FinalPermute())
        Write_Permutations_();
}